

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mime.h
# Opt level: O3

string * MimeTypes::get(string *__return_storage_ptr__,string *ext)

{
  size_t __n;
  int iVar1;
  long lVar2;
  
  __n = ext->_M_string_length;
  lVar2 = 0x28;
  while ((__n != *(size_t *)(&completed_0 + lVar2) ||
         ((__n != 0 &&
          (iVar1 = bcmp((ext->_M_dataplus)._M_p,
                        *(void **)((long)&DW_ref___gxx_personality_v0 + lVar2),__n), iVar1 != 0)))))
  {
    lVar2 = lVar2 + 0x40;
    if (lVar2 == 0x55e8) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*(long *)(lVar2 + 0x122218),
             *(long *)((long)&mimeType[0].extension._M_dataplus._M_p + lVar2) +
             *(long *)(lVar2 + 0x122218));
  return __return_storage_ptr__;
}

Assistant:

static std::string get(std::string ext)
    {
        for (int i = 0; i < MIME_SIZE; i++) {
            if (ext == MimeTypes::mimeType[i].extension) return MimeTypes::mimeType[i].mime;
        }
        return "";
    }